

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O1

char * __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::MILSpec::Function_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
::
Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::MILSpec::Function_AttributesEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>
::_InternalParse(Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::MILSpec::Function_AttributesEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>
                 *this,char *ptr,ParseContext *ctx)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  byte bVar1;
  size_type sVar2;
  int iVar3;
  bool bVar4;
  char *ptr_00;
  ulong extraout_RAX;
  uint size;
  int iVar5;
  pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>::InnerMap::iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>,_bool>
  *__return_storage_ptr__;
  pair<const_char_*,_int> pVar6;
  pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>::InnerMap::iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>,_bool>
  *local_58;
  pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>::InnerMap::iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>,_bool>
  local_50;
  
  local_58 = (pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>::InnerMap::iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>,_bool>
              *)ptr;
  bVar4 = EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_58,ctx->group_depth_);
  if ((bVar4) || (*(char *)&(local_58->first).node_ != '\n')) {
    if (local_58 ==
        (pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>::InnerMap::iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>,_bool>
         *)0x0) {
      return (char *)0x0;
    }
    MapEntryImpl<CoreML::Specification::MILSpec::Function_AttributesEntry_DoNotUse,google::protobuf::MessageLite,std::__cxx11::string,CoreML::Specification::MILSpec::Value,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)11>
    ::
    Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::MILSpec::Function_AttributesEntry_DoNotUse,std::__cxx11::string,CoreML::Specification::MILSpec::Value,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)11>,google::protobuf::Map<std::__cxx11::string,CoreML::Specification::MILSpec::Value>>
    ::_InternalParse(this);
    goto LAB_0023f7e9;
  }
  bVar1 = *(byte *)((long)&(local_58->first).node_ + 1);
  size = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    pVar6 = ReadSizeFallback((char *)((long)&(local_58->first).node_ + 1),(uint)bVar1);
    size = pVar6.second;
    ptr_00 = pVar6.first;
  }
  else {
    ptr_00 = (char *)((long)&(local_58->first).node_ + 2);
  }
  s = &this->key_;
  if (ptr_00 == (char *)0x0) {
    local_58 = (pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>::InnerMap::iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>,_bool>
                *)0x0;
  }
  else {
    local_58 = (pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>::InnerMap::iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>,_bool>
                *)EpsCopyInputStream::ReadString(&ctx->super_EpsCopyInputStream,ptr_00,size,s);
  }
  if (local_58 ==
      (pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>::InnerMap::iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>,_bool>
       *)0x0) {
    return (char *)0x0;
  }
  bVar4 = WireFormatLite::VerifyUtf8String
                    ((this->key_)._M_dataplus._M_p,(int)(this->key_)._M_string_length,PARSE,
                     "CoreML.Specification.MILSpec.Function.AttributesEntry.key");
  if (!bVar4) {
    return (char *)0x0;
  }
  bVar4 = EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_58,ctx->group_depth_);
  if ((bVar4) || (*(char *)&(local_58->first).node_ != '\x12')) {
    if (local_58 ==
        (pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>::InnerMap::iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>,_bool>
         *)0x0) {
      return (char *)0x0;
    }
LAB_0023f7d6:
    MapEntryImpl<CoreML::Specification::MILSpec::Function_AttributesEntry_DoNotUse,google::protobuf::MessageLite,std::__cxx11::string,CoreML::Specification::MILSpec::Value,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)11>
    ::
    Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::MILSpec::Function_AttributesEntry_DoNotUse,std::__cxx11::string,CoreML::Specification::MILSpec::Value,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)11>,google::protobuf::Map<std::__cxx11::string,CoreML::Specification::MILSpec::Value>>
    ::_InternalParse(this);
  }
  else {
    sVar2 = (this->map_->elements_).num_elements_;
    __return_storage_ptr__ = &local_50;
    Map<std::__cxx11::string,CoreML::Specification::MILSpec::Value>::InnerMap::
    insert<std::__cxx11::string&>(__return_storage_ptr__,this->map_,s);
    this->value_ptr_ = (Value *)&(local_50.first.node_)->field_0x20;
    if (sVar2 == (this->map_->elements_).num_elements_) {
      iVar5 = 0;
    }
    else {
      local_58 = (pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>::InnerMap::iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>,_bool>
                  *)ParseContext::ParseMessage
                              (ctx,(MessageLite *)&(local_50.first.node_)->field_0x20,
                               (char *)((long)&(local_58->first).node_ + 1));
      if (local_58 ==
          (pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>::InnerMap::iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>,_bool>
           *)0x0) {
        iVar3 = 1;
LAB_0023f85a:
        iVar5 = iVar3;
        Map<std::__cxx11::string,CoreML::Specification::MILSpec::Value>::erase<std::__cxx11::string>
                  ((Map<std::__cxx11::string,CoreML::Specification::MILSpec::Value> *)this->map_,s);
        __return_storage_ptr__ =
             (pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>::InnerMap::iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>,_bool>
              *)0x0;
      }
      else {
        bVar4 = EpsCopyInputStream::DoneWithCheck
                          (&ctx->super_EpsCopyInputStream,(char **)&local_58,ctx->group_depth_);
        iVar5 = 1;
        __return_storage_ptr__ = local_58;
        if (!bVar4) {
          MapEntryImpl<CoreML::Specification::MILSpec::Function_AttributesEntry_DoNotUse,google::protobuf::MessageLite,std::__cxx11::string,CoreML::Specification::MILSpec::Value,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)11>
          ::
          Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::MILSpec::Function_AttributesEntry_DoNotUse,std::__cxx11::string,CoreML::Specification::MILSpec::Value,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)11>,google::protobuf::Map<std::__cxx11::string,CoreML::Specification::MILSpec::Value>>
          ::_InternalParse();
          iVar3 = 2;
          if ((extraout_RAX & 1) == 0) goto LAB_0023f85a;
          __return_storage_ptr__ =
               (pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>::InnerMap::iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>,_bool>
                *)0x0;
        }
      }
    }
    if (iVar5 == 1) {
      return (char *)__return_storage_ptr__;
    }
    if (iVar5 == 0) goto LAB_0023f7d6;
  }
  MapEntryImpl<CoreML::Specification::MILSpec::Function_AttributesEntry_DoNotUse,google::protobuf::MessageLite,std::__cxx11::string,CoreML::Specification::MILSpec::Value,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)11>
  ::
  Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::MILSpec::Function_AttributesEntry_DoNotUse,std::__cxx11::string,CoreML::Specification::MILSpec::Value,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)11>,google::protobuf::Map<std::__cxx11::string,CoreML::Specification::MILSpec::Value>>
  ::_InternalParse();
LAB_0023f7e9:
  local_58 = (pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>::InnerMap::iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>,_bool>
              *)MapEntryImpl<CoreML::Specification::MILSpec::Function_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                ::_InternalParse(this->entry_,(char *)local_58,ctx);
  if (local_58 !=
      (pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>::InnerMap::iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>,_bool>
       *)0x0) {
    UseKeyAndValueFromEntry(this);
  }
  return (char *)local_58;
}

Assistant:

const char* _InternalParse(const char* ptr, ParseContext* ctx) {
      if (PROTOBUF_PREDICT_TRUE(!ctx->Done(&ptr) && *ptr == kKeyTag)) {
        ptr = KeyTypeHandler::Read(ptr + 1, ctx, &key_);
        if (PROTOBUF_PREDICT_FALSE(!ptr || !Derived::ValidateKey(&key_))) {
          return nullptr;
        }
        if (PROTOBUF_PREDICT_TRUE(!ctx->Done(&ptr) && *ptr == kValueTag)) {
          typename Map::size_type map_size = map_->size();
          value_ptr_ = &(*map_)[key_];
          if (PROTOBUF_PREDICT_TRUE(map_size != map_->size())) {
            using T =
                typename MapIf<ValueTypeHandler::kIsEnum, int*, Value*>::type;
            ptr = ValueTypeHandler::Read(ptr + 1, ctx,
                                         reinterpret_cast<T>(value_ptr_));
            if (PROTOBUF_PREDICT_FALSE(!ptr ||
                                       !Derived::ValidateValue(value_ptr_))) {
              map_->erase(key_);  // Failure! Undo insertion.
              return nullptr;
            }
            if (PROTOBUF_PREDICT_TRUE(ctx->Done(&ptr))) return ptr;
            if (!ptr) return nullptr;
            NewEntry();
            ValueMover::Move(value_ptr_, entry_->mutable_value());
            map_->erase(key_);
            goto move_key;
          }
        } else {
          if (!ptr) return nullptr;
        }
        NewEntry();
      move_key:
        KeyMover::Move(&key_, entry_->mutable_key());
      } else {
        if (!ptr) return nullptr;
        NewEntry();
      }
      ptr = entry_->_InternalParse(ptr, ctx);
      if (ptr) UseKeyAndValueFromEntry();
      return ptr;
    }